

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall
Rml::DataParser::Function(DataParser *this,Instruction instruction,int num_arguments,String *name)

{
  code *pcVar1;
  bool bVar2;
  int local_5c;
  InstructionData local_58;
  
  if ((instruction != EventFnc) && (instruction != TransformFnc)) {
    bVar2 = Assert("RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0xf4);
    if (!bVar2) goto LAB_00262814;
  }
  if (num_arguments < 0) {
    bVar2 = Assert("RMLUI_ASSERT(num_arguments >= 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0xf5);
    if (!bVar2) {
LAB_00262814:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (this->program_stack_size < num_arguments) {
    CreateString_abi_cxx11_
              ((String *)&local_58,
               "Internal parser error: Popping %d arguments, but the stack contains only %d elements."
               ,(ulong)(uint)num_arguments);
    Error(this,(String *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    this->program_stack_size = this->program_stack_size - num_arguments;
    local_58.instruction = NumArguments;
    local_5c = num_arguments;
    Variant::Variant<int,void>(&local_58.data,&local_5c);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,&local_58);
    Variant::~Variant(&local_58.data);
    local_58.instruction = instruction;
    Variant::Variant<std::__cxx11::string,void>(&local_58.data,name);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,&local_58);
    Variant::~Variant(&local_58.data);
  }
  return;
}

Assistant:

void Function(Instruction instruction, int num_arguments, String&& name)
	{
		RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc);
		RMLUI_ASSERT(num_arguments >= 0);
		if (program_stack_size < num_arguments)
		{
			Error(CreateString("Internal parser error: Popping %d arguments, but the stack contains only %d elements.", num_arguments,
				program_stack_size));
			return;
		}
		program_stack_size -= num_arguments;
		program.push_back(InstructionData{Instruction::NumArguments, Variant(int(num_arguments))});
		program.push_back(InstructionData{instruction, Variant(std::move(name))});
	}